

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::TTEventList::Iterator::MovePrevious_ReplayOnly(Iterator *this)

{
  BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  unsigned_long uVar1;
  EventLogEntry *pEVar2;
  ulong local_28;
  size_t npos;
  EventLogEntry *data;
  Iterator *local_10;
  Iterator *this_local;
  
  local_10 = this;
  if (this->m_currLink->StartPos < this->m_currIdx) {
    this_00 = this->m_previousEventMap;
    data = Current(this);
    uVar1 = JsUtil::
            BaseDictionary<const_TTD::NSLogEvents::EventLogEntry_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(this_00,&data);
    this->m_currIdx = uVar1;
  }
  else {
    this->m_currLink = this->m_currLink->Previous;
    this->m_currIdx = 0;
    if ((this->m_currLink != (TTEventListLink *)0x0) &&
       (this->m_currIdx < this->m_currLink->CurrPos)) {
      pEVar2 = Current(this);
      for (local_28 = this->m_vtable[pEVar2->EventKind].DataSize;
          local_28 < this->m_currLink->CurrPos;
          local_28 = this->m_vtable[pEVar2->EventKind].DataSize + local_28) {
        this->m_currIdx = local_28;
        pEVar2 = Current(this);
      }
    }
  }
  return;
}

Assistant:

void TTEventList::Iterator::MovePrevious_ReplayOnly()
    {
        if(this->m_currIdx > this->m_currLink->StartPos)
        {
            this->m_currIdx = this->m_previousEventMap->Item(this->Current());
        }
        else
        {
            this->m_currLink = this->m_currLink->Previous;
            this->m_currIdx = 0;

            //move index to the last element
            if(this->m_currLink != nullptr && this->m_currIdx < this->m_currLink->CurrPos)
            {
                NSLogEvents::EventLogEntry* data = this->Current();
                size_t npos = this->m_vtable[(uint32)data->EventKind].DataSize;
                while(npos < this->m_currLink->CurrPos)
                {
                    this->m_currIdx = npos;
                    data = this->Current();
                    npos += this->m_vtable[(uint32)data->EventKind].DataSize;
                }
            }
        }
    }